

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O2

void __thiscall soplex::SSVectorBase<double>::setup(SSVectorBase<double> *this)

{
  int *piVar1;
  double dVar2;
  pointer pdVar3;
  pointer pdVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  
  if (this->setupStatus == false) {
    pdVar3 = (this->super_VectorBase<double>).val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    pdVar4 = (this->super_VectorBase<double>).val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    (this->super_IdxSet).num = 0;
    uVar5 = (ulong)((long)pdVar3 - (long)pdVar4) >> 3;
    uVar7 = 0;
    uVar6 = uVar5 & 0xffffffff;
    if ((int)uVar5 < 1) {
      uVar6 = uVar7;
    }
    for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
      dVar2 = (this->super_VectorBase<double>).val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar7];
      if ((dVar2 != 0.0) || (NAN(dVar2))) {
        dVar8 = getEpsilon(this);
        if (ABS(dVar2) <= dVar8) {
          (this->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar7] = 0.0;
        }
        else {
          (this->super_IdxSet).idx[(this->super_IdxSet).num] = (int)uVar7;
          piVar1 = &(this->super_IdxSet).num;
          *piVar1 = *piVar1 + 1;
        }
      }
    }
    this->setupStatus = true;
  }
  return;
}

Assistant:

void setup()
   {
      if(!isSetup())
      {
         IdxSet::clear();

         int d = dim();
         num = 0;

         for(int i = 0; i < d; ++i)
         {
            if(VectorBase<R>::val[i] != R(0))
            {
               if(spxAbs(VectorBase<R>::val[i]) <= this->getEpsilon())
                  VectorBase<R>::val[i] = R(0);
               else
               {
                  idx[num] = i;
                  num++;
               }
            }
         }

         setupStatus = true;

         assert(isConsistent());
      }
   }